

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O2

void x25519_sc_reduce(uint8_t *s)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  
  uVar14 = (ulong)(*(uint *)(s + 0x3c) >> 3);
  lVar5 = uVar14 * -0xa6f7d + ((ulong)((s[0x2c] & 0x1f) << 0x10) | (ulong)*(ushort *)(s + 0x2a));
  uVar21 = (ulong)(*(uint *)(s + 0x39) >> 6 & 0x1fffff);
  uVar28 = (ulong)(*(uint3 *)(s + 0x37) >> 1 & 0x1fffff);
  lVar1 = uVar28 * -0xa6f7d +
          uVar21 * 0x215d1 + uVar14 * -0xf39ad + (ulong)(*(uint *)(s + 0x24) >> 6 & 0x1fffff);
  uVar10 = (ulong)(*(uint *)(s + 0x34) >> 4 & 0x1fffff);
  uVar8 = (ulong)(*(uint *)(s + 0x31) >> 7 & 0x1fffff);
  lVar2 = uVar8 * -0xa6f7d + (ulong)(*(uint *)(s + 0x1f) >> 4 & 0x1fffff) +
          uVar10 * 0x215d1 + uVar14 * 0x72d18 + uVar21 * 0x9fb67 + uVar28 * -0xf39ad;
  uVar24 = (ulong)(*(uint3 *)(s + 0x2f) >> 2 & 0x1fffff);
  lVar19 = uVar24 * 0xa2c13 + (ulong)(*(uint *)(s + 0xf) >> 6 & 0x1fffff);
  lVar13 = uVar24 * 0x9fb67 +
           uVar8 * 0x72d18 + ((ulong)((s[0x17] & 0x1f) << 0x10) | (ulong)*(ushort *)(s + 0x15)) +
           uVar10 * 0xa2c13;
  lVar11 = uVar24 * 0x215d1 +
           uVar8 * -0xf39ad + (ulong)(*(uint3 *)(s + 0x1a) >> 2 & 0x1fffff) + uVar10 * 0x9fb67 +
           uVar28 * 0x72d18 + uVar21 * 0xa2c13;
  uVar3 = lVar19 + 0x100000;
  lVar25 = (uVar3 >> 0x15) + uVar24 * 0x72d18 + uVar8 * 0xa2c13 + (ulong)(*(uint3 *)(s + 0x12) >> 3)
  ;
  uVar4 = lVar13 + 0x100000;
  lVar16 = (uVar4 >> 0x15) +
           uVar24 * -0xf39ad +
           uVar8 * 0x9fb67 + (ulong)(*(uint *)(s + 0x17) >> 5 & 0x1fffff) + uVar10 * 0x72d18 +
           uVar28 * 0xa2c13;
  uVar7 = lVar11 + 0x100000;
  lVar6 = ((long)uVar7 >> 0x15) +
          uVar24 * -0xa6f7d +
          uVar8 * 0x215d1 + (ulong)(*(uint *)(s + 0x1c) >> 7 & 0x1fffff) + uVar10 * -0xf39ad +
          uVar28 * 0x9fb67 + uVar21 * 0x72d18 + uVar14 * 0xa2c13;
  uVar8 = lVar2 + 0x100000;
  lVar29 = ((long)uVar8 >> 0x15) +
           uVar10 * -0xa6f7d + uVar14 * 0x9fb67 + (ulong)(*(uint3 *)(s + 0x22) >> 1 & 0x1fffff) +
           uVar21 * -0xf39ad + uVar28 * 0x215d1;
  uVar10 = lVar1 + 0x100000;
  lVar9 = ((long)uVar10 >> 0x15) +
          uVar21 * -0xa6f7d + uVar14 * 0x215d1 + (ulong)(*(uint3 *)(s + 0x27) >> 3);
  uVar14 = lVar5 + 0x100000;
  lVar34 = ((long)uVar14 >> 0x15) + (ulong)(*(uint *)(s + 0x2c) >> 5 & 0x1fffff);
  uVar21 = lVar25 + 0x100000;
  uVar24 = lVar6 + 0x100000;
  lVar31 = ((long)uVar24 >> 0x15) + (lVar2 - (uVar8 & 0xffffffffffe00000));
  uVar8 = lVar29 + 0x100000;
  lVar20 = ((long)uVar8 >> 0x15) + (lVar1 - (uVar10 & 0xffffffffffe00000));
  lVar29 = lVar29 - (uVar8 & 0xffffffffffe00000);
  uVar8 = lVar9 + 0x100000;
  lVar35 = ((long)uVar8 >> 0x15) + (lVar5 - (uVar14 & 0xffffffffffe00000));
  lVar9 = lVar9 - (uVar8 & 0xffffffffffe00000);
  uVar14 = lVar16 + 0x100000;
  lVar26 = ((lVar34 * -0xa6f7d + lVar11) - (uVar7 & 0xffffffffffe00000)) + ((long)uVar14 >> 0x15);
  lVar13 = lVar9 * -0xa6f7d +
           lVar35 * 0x215d1 +
           lVar34 * -0xf39ad + (lVar13 - (uVar4 & 0xfffffe00000)) + (uVar21 >> 0x15);
  lVar22 = lVar29 * -0xa6f7d + lVar20 * 0x215d1 +
           lVar9 * -0xf39ad +
           lVar35 * 0x9fb67 + lVar34 * 0x72d18 + (lVar19 - (uVar3 & 0xffffffffffe00000));
  lVar33 = lVar31 * 0xa2c13 + ((ulong)((s[2] & 0x1f) << 0x10) | (ulong)*(ushort *)s);
  lVar19 = lVar31 * 0x9fb67 + lVar29 * 0x72d18 +
           lVar20 * 0xa2c13 + (ulong)(*(uint3 *)(s + 5) >> 2 & 0x1fffff);
  lVar1 = lVar31 * 0x215d1 +
          lVar29 * -0xf39ad + lVar20 * 0x9fb67 +
          lVar9 * 0x72d18 + lVar35 * 0xa2c13 + (ulong)(*(uint *)(s + 10) >> 4 & 0x1fffff);
  uVar3 = lVar33 + 0x100000;
  lVar11 = ((long)uVar3 >> 0x15) +
           lVar31 * 0x72d18 + lVar29 * 0xa2c13 + (ulong)(*(uint *)(s + 2) >> 5 & 0x1fffff);
  uVar4 = lVar19 + 0x100000;
  lVar2 = ((long)uVar4 >> 0x15) +
          lVar31 * -0xf39ad + lVar29 * 0x9fb67 +
          lVar20 * 0x72d18 + lVar9 * 0xa2c13 + (ulong)(*(uint *)(s + 7) >> 7 & 0x1fffff);
  uVar7 = lVar1 + 0x100000;
  lVar5 = ((long)uVar7 >> 0x15) +
          lVar31 * -0xa6f7d +
          lVar29 * 0x215d1 + lVar20 * -0xf39ad +
          lVar9 * 0x9fb67 +
          lVar35 * 0x72d18 + lVar34 * 0xa2c13 + (ulong)(*(uint3 *)(s + 0xd) >> 1 & 0x1fffff);
  uVar8 = lVar22 + 0x100000;
  lVar20 = ((long)uVar8 >> 0x15) +
           lVar20 * -0xa6f7d +
           lVar9 * 0x215d1 +
           lVar35 * -0xf39ad + lVar34 * 0x9fb67 + (lVar25 - (uVar21 & 0x1fffffe00000));
  uVar10 = lVar13 + 0x100000;
  lVar9 = ((lVar34 * 0x215d1 + lVar16) - (uVar14 & 0xffffffffffe00000)) + lVar35 * -0xa6f7d +
          ((long)uVar10 >> 0x15);
  uVar14 = lVar26 + 0x100000;
  lVar16 = ((long)uVar14 >> 0x15) + (lVar6 - (uVar24 & 0xffffffffffe00000));
  uVar21 = lVar5 + 0x100000;
  uVar24 = lVar20 + 0x100000;
  uVar28 = lVar9 + 0x100000;
  uVar12 = lVar11 + 0x100000;
  uVar23 = lVar2 + 0x100000;
  uVar17 = lVar16 + 0x100000;
  lVar6 = (long)uVar17 >> 0x15;
  uVar27 = lVar6 * 0xa2c13 + (lVar33 - (uVar3 & 0xffffffffffe00000));
  uVar32 = ((lVar6 * 0x72d18 + lVar11) - (uVar12 & 0xffffffffffe00000)) + ((long)uVar27 >> 0x15);
  uVar3 = ((lVar6 * 0x9fb67 + lVar19) - (uVar4 & 0xffffffffffe00000)) + ((long)uVar12 >> 0x15) +
          ((long)uVar32 >> 0x15);
  uVar18 = ((lVar6 * -0xf39ad + lVar2) - (uVar23 & 0xffffffffffe00000)) + ((long)uVar3 >> 0x15);
  uVar23 = ((lVar6 * 0x215d1 + lVar1) - (uVar7 & 0xffffffffffe00000)) + ((long)uVar23 >> 0x15) +
           ((long)uVar18 >> 0x15);
  uVar12 = ((lVar6 * -0xa6f7d + lVar5) - (uVar21 & 0xffffffffffe00000)) + ((long)uVar23 >> 0x15);
  uVar7 = ((long)uVar12 >> 0x15) + ((long)uVar21 >> 0x15) + (lVar22 - (uVar8 & 0xffffffffffe00000));
  uVar8 = ((long)uVar7 >> 0x15) + (lVar20 - (uVar24 & 0xffffffffffe00000));
  uVar10 = ((long)uVar8 >> 0x15) + ((long)uVar24 >> 0x15) + (lVar13 - (uVar10 & 0xffffffffffe00000))
  ;
  uVar36 = ((long)uVar10 >> 0x15) + (lVar9 - (uVar28 & 0xffffffffffe00000));
  uVar30 = ((long)uVar36 >> 0x15) +
           ((long)uVar28 >> 0x15) + (lVar26 - (uVar14 & 0xffffffffffe00000));
  lVar5 = ((long)uVar30 >> 0x15) + (lVar16 - (uVar17 & 0xffffffffffe00000));
  lVar2 = lVar5 >> 0x15;
  lVar1 = lVar2 * 0xa2c13 + (uVar27 & 0x1fffff);
  uVar4 = (lVar1 >> 0x15) + lVar2 * 0x72d18 + (uVar32 & 0x1fffff);
  uVar17 = ((long)uVar4 >> 0x15) + lVar2 * 0x9fb67 + (uVar3 & 0x1fffff);
  uVar28 = ((long)uVar17 >> 0x15) + lVar2 * -0xf39ad + (uVar18 & 0x1fffff);
  uVar24 = ((long)uVar28 >> 0x15) + lVar2 * 0x215d1 + (uVar23 & 0x1fffff);
  uVar21 = ((long)uVar24 >> 0x15) + lVar2 * -0xa6f7d + (uVar12 & 0x1fffff);
  uVar14 = ((long)uVar21 >> 0x15) + (uVar7 & 0x1fffff);
  uVar7 = ((long)uVar14 >> 0x15) + (uVar8 & 0x1fffff);
  lVar2 = ((long)uVar7 >> 0x15) + (uVar10 & 0x1fffff);
  uVar3 = (lVar2 >> 0x15) + (uVar36 & 0x1fffff);
  uVar8 = ((long)uVar3 >> 0x15) + (uVar30 & 0x1fffff);
  uVar15 = (int)(uVar8 >> 0x15) + ((uint)lVar5 & 0x1fffff);
  *s = (uint8_t)lVar1;
  s[1] = (uint8_t)((ulong)lVar1 >> 8);
  s[2] = (byte)((uint)uVar4 << 5) | (byte)((ulong)lVar1 >> 0x10) & 0x1f;
  s[3] = (uint8_t)(uVar4 >> 3);
  s[4] = (uint8_t)(uVar4 >> 0xb);
  s[5] = ((byte)((uint)uVar4 >> 0x13) & 3) + (char)uVar17 * '\x04';
  s[6] = (uint8_t)(uVar17 >> 6);
  s[7] = (byte)((uint)uVar28 << 7) | (byte)((uint)uVar17 >> 0xe) & 0x7f;
  s[8] = (uint8_t)(uVar28 >> 1);
  s[9] = (uint8_t)(uVar28 >> 9);
  s[10] = (byte)((uint)uVar24 << 4) | (byte)((uint)uVar28 >> 0x11) & 0xf;
  s[0xb] = (uint8_t)(uVar24 >> 4);
  s[0xc] = (uint8_t)(uVar24 >> 0xc);
  s[0xd] = ((byte)((uint)uVar24 >> 0x14) & 1) + (char)uVar21 * '\x02';
  s[0xe] = (uint8_t)(uVar21 >> 7);
  s[0xf] = (byte)((uint)uVar14 << 6) | (byte)((uint)uVar21 >> 0xf) & 0x3f;
  s[0x10] = (uint8_t)(uVar14 >> 2);
  s[0x11] = (uint8_t)(uVar14 >> 10);
  s[0x12] = ((byte)((uint)uVar14 >> 0x12) & 7) + (char)uVar7 * '\b';
  s[0x13] = (uint8_t)(uVar7 >> 5);
  s[0x14] = (uint8_t)((uint)uVar7 >> 0xd);
  s[0x15] = (uint8_t)lVar2;
  s[0x16] = (uint8_t)((ulong)lVar2 >> 8);
  s[0x17] = (byte)((uint)uVar3 << 5) | (byte)((ulong)lVar2 >> 0x10) & 0x1f;
  s[0x18] = (uint8_t)(uVar3 >> 3);
  s[0x19] = (uint8_t)(uVar3 >> 0xb);
  s[0x1a] = ((byte)((uint)uVar3 >> 0x13) & 3) + (char)uVar8 * '\x04';
  s[0x1b] = (uint8_t)(uVar8 >> 6);
  s[0x1c] = (char)uVar15 * -0x80 | (byte)((uint)uVar8 >> 0xe) & 0x7f;
  s[0x1d] = (uint8_t)(uVar15 >> 1);
  s[0x1e] = (uint8_t)(uVar15 >> 9);
  s[0x1f] = (uint8_t)(uVar15 >> 0x11);
  return;
}

Assistant:

void x25519_sc_reduce(uint8_t s[64]) {
  int64_t s0 = 2097151 & load_3(s);
  int64_t s1 = 2097151 & (load_4(s + 2) >> 5);
  int64_t s2 = 2097151 & (load_3(s + 5) >> 2);
  int64_t s3 = 2097151 & (load_4(s + 7) >> 7);
  int64_t s4 = 2097151 & (load_4(s + 10) >> 4);
  int64_t s5 = 2097151 & (load_3(s + 13) >> 1);
  int64_t s6 = 2097151 & (load_4(s + 15) >> 6);
  int64_t s7 = 2097151 & (load_3(s + 18) >> 3);
  int64_t s8 = 2097151 & load_3(s + 21);
  int64_t s9 = 2097151 & (load_4(s + 23) >> 5);
  int64_t s10 = 2097151 & (load_3(s + 26) >> 2);
  int64_t s11 = 2097151 & (load_4(s + 28) >> 7);
  int64_t s12 = 2097151 & (load_4(s + 31) >> 4);
  int64_t s13 = 2097151 & (load_3(s + 34) >> 1);
  int64_t s14 = 2097151 & (load_4(s + 36) >> 6);
  int64_t s15 = 2097151 & (load_3(s + 39) >> 3);
  int64_t s16 = 2097151 & load_3(s + 42);
  int64_t s17 = 2097151 & (load_4(s + 44) >> 5);
  int64_t s18 = 2097151 & (load_3(s + 47) >> 2);
  int64_t s19 = 2097151 & (load_4(s + 49) >> 7);
  int64_t s20 = 2097151 & (load_4(s + 52) >> 4);
  int64_t s21 = 2097151 & (load_3(s + 55) >> 1);
  int64_t s22 = 2097151 & (load_4(s + 57) >> 6);
  int64_t s23 = (load_4(s + 60) >> 3);
  int64_t carry0;
  int64_t carry1;
  int64_t carry2;
  int64_t carry3;
  int64_t carry4;
  int64_t carry5;
  int64_t carry6;
  int64_t carry7;
  int64_t carry8;
  int64_t carry9;
  int64_t carry10;
  int64_t carry11;
  int64_t carry12;
  int64_t carry13;
  int64_t carry14;
  int64_t carry15;
  int64_t carry16;

  s11 += s23 * 666643;
  s12 += s23 * 470296;
  s13 += s23 * 654183;
  s14 -= s23 * 997805;
  s15 += s23 * 136657;
  s16 -= s23 * 683901;
  s23 = 0;

  s10 += s22 * 666643;
  s11 += s22 * 470296;
  s12 += s22 * 654183;
  s13 -= s22 * 997805;
  s14 += s22 * 136657;
  s15 -= s22 * 683901;
  s22 = 0;

  s9 += s21 * 666643;
  s10 += s21 * 470296;
  s11 += s21 * 654183;
  s12 -= s21 * 997805;
  s13 += s21 * 136657;
  s14 -= s21 * 683901;
  s21 = 0;

  s8 += s20 * 666643;
  s9 += s20 * 470296;
  s10 += s20 * 654183;
  s11 -= s20 * 997805;
  s12 += s20 * 136657;
  s13 -= s20 * 683901;
  s20 = 0;

  s7 += s19 * 666643;
  s8 += s19 * 470296;
  s9 += s19 * 654183;
  s10 -= s19 * 997805;
  s11 += s19 * 136657;
  s12 -= s19 * 683901;
  s19 = 0;

  s6 += s18 * 666643;
  s7 += s18 * 470296;
  s8 += s18 * 654183;
  s9 -= s18 * 997805;
  s10 += s18 * 136657;
  s11 -= s18 * 683901;
  s18 = 0;

  carry6 = (s6 + (1 << 20)) >> 21;
  s7 += carry6;
  s6 -= int64_lshift21(carry6);
  carry8 = (s8 + (1 << 20)) >> 21;
  s9 += carry8;
  s8 -= int64_lshift21(carry8);
  carry10 = (s10 + (1 << 20)) >> 21;
  s11 += carry10;
  s10 -= int64_lshift21(carry10);
  carry12 = (s12 + (1 << 20)) >> 21;
  s13 += carry12;
  s12 -= int64_lshift21(carry12);
  carry14 = (s14 + (1 << 20)) >> 21;
  s15 += carry14;
  s14 -= int64_lshift21(carry14);
  carry16 = (s16 + (1 << 20)) >> 21;
  s17 += carry16;
  s16 -= int64_lshift21(carry16);

  carry7 = (s7 + (1 << 20)) >> 21;
  s8 += carry7;
  s7 -= int64_lshift21(carry7);
  carry9 = (s9 + (1 << 20)) >> 21;
  s10 += carry9;
  s9 -= int64_lshift21(carry9);
  carry11 = (s11 + (1 << 20)) >> 21;
  s12 += carry11;
  s11 -= int64_lshift21(carry11);
  carry13 = (s13 + (1 << 20)) >> 21;
  s14 += carry13;
  s13 -= int64_lshift21(carry13);
  carry15 = (s15 + (1 << 20)) >> 21;
  s16 += carry15;
  s15 -= int64_lshift21(carry15);

  s5 += s17 * 666643;
  s6 += s17 * 470296;
  s7 += s17 * 654183;
  s8 -= s17 * 997805;
  s9 += s17 * 136657;
  s10 -= s17 * 683901;
  s17 = 0;

  s4 += s16 * 666643;
  s5 += s16 * 470296;
  s6 += s16 * 654183;
  s7 -= s16 * 997805;
  s8 += s16 * 136657;
  s9 -= s16 * 683901;
  s16 = 0;

  s3 += s15 * 666643;
  s4 += s15 * 470296;
  s5 += s15 * 654183;
  s6 -= s15 * 997805;
  s7 += s15 * 136657;
  s8 -= s15 * 683901;
  s15 = 0;

  s2 += s14 * 666643;
  s3 += s14 * 470296;
  s4 += s14 * 654183;
  s5 -= s14 * 997805;
  s6 += s14 * 136657;
  s7 -= s14 * 683901;
  s14 = 0;

  s1 += s13 * 666643;
  s2 += s13 * 470296;
  s3 += s13 * 654183;
  s4 -= s13 * 997805;
  s5 += s13 * 136657;
  s6 -= s13 * 683901;
  s13 = 0;

  s0 += s12 * 666643;
  s1 += s12 * 470296;
  s2 += s12 * 654183;
  s3 -= s12 * 997805;
  s4 += s12 * 136657;
  s5 -= s12 * 683901;
  s12 = 0;

  carry0 = (s0 + (1 << 20)) >> 21;
  s1 += carry0;
  s0 -= int64_lshift21(carry0);
  carry2 = (s2 + (1 << 20)) >> 21;
  s3 += carry2;
  s2 -= int64_lshift21(carry2);
  carry4 = (s4 + (1 << 20)) >> 21;
  s5 += carry4;
  s4 -= int64_lshift21(carry4);
  carry6 = (s6 + (1 << 20)) >> 21;
  s7 += carry6;
  s6 -= int64_lshift21(carry6);
  carry8 = (s8 + (1 << 20)) >> 21;
  s9 += carry8;
  s8 -= int64_lshift21(carry8);
  carry10 = (s10 + (1 << 20)) >> 21;
  s11 += carry10;
  s10 -= int64_lshift21(carry10);

  carry1 = (s1 + (1 << 20)) >> 21;
  s2 += carry1;
  s1 -= int64_lshift21(carry1);
  carry3 = (s3 + (1 << 20)) >> 21;
  s4 += carry3;
  s3 -= int64_lshift21(carry3);
  carry5 = (s5 + (1 << 20)) >> 21;
  s6 += carry5;
  s5 -= int64_lshift21(carry5);
  carry7 = (s7 + (1 << 20)) >> 21;
  s8 += carry7;
  s7 -= int64_lshift21(carry7);
  carry9 = (s9 + (1 << 20)) >> 21;
  s10 += carry9;
  s9 -= int64_lshift21(carry9);
  carry11 = (s11 + (1 << 20)) >> 21;
  s12 += carry11;
  s11 -= int64_lshift21(carry11);

  s0 += s12 * 666643;
  s1 += s12 * 470296;
  s2 += s12 * 654183;
  s3 -= s12 * 997805;
  s4 += s12 * 136657;
  s5 -= s12 * 683901;
  s12 = 0;

  carry0 = s0 >> 21;
  s1 += carry0;
  s0 -= int64_lshift21(carry0);
  carry1 = s1 >> 21;
  s2 += carry1;
  s1 -= int64_lshift21(carry1);
  carry2 = s2 >> 21;
  s3 += carry2;
  s2 -= int64_lshift21(carry2);
  carry3 = s3 >> 21;
  s4 += carry3;
  s3 -= int64_lshift21(carry3);
  carry4 = s4 >> 21;
  s5 += carry4;
  s4 -= int64_lshift21(carry4);
  carry5 = s5 >> 21;
  s6 += carry5;
  s5 -= int64_lshift21(carry5);
  carry6 = s6 >> 21;
  s7 += carry6;
  s6 -= int64_lshift21(carry6);
  carry7 = s7 >> 21;
  s8 += carry7;
  s7 -= int64_lshift21(carry7);
  carry8 = s8 >> 21;
  s9 += carry8;
  s8 -= int64_lshift21(carry8);
  carry9 = s9 >> 21;
  s10 += carry9;
  s9 -= int64_lshift21(carry9);
  carry10 = s10 >> 21;
  s11 += carry10;
  s10 -= int64_lshift21(carry10);
  carry11 = s11 >> 21;
  s12 += carry11;
  s11 -= int64_lshift21(carry11);

  s0 += s12 * 666643;
  s1 += s12 * 470296;
  s2 += s12 * 654183;
  s3 -= s12 * 997805;
  s4 += s12 * 136657;
  s5 -= s12 * 683901;
  s12 = 0;

  carry0 = s0 >> 21;
  s1 += carry0;
  s0 -= int64_lshift21(carry0);
  carry1 = s1 >> 21;
  s2 += carry1;
  s1 -= int64_lshift21(carry1);
  carry2 = s2 >> 21;
  s3 += carry2;
  s2 -= int64_lshift21(carry2);
  carry3 = s3 >> 21;
  s4 += carry3;
  s3 -= int64_lshift21(carry3);
  carry4 = s4 >> 21;
  s5 += carry4;
  s4 -= int64_lshift21(carry4);
  carry5 = s5 >> 21;
  s6 += carry5;
  s5 -= int64_lshift21(carry5);
  carry6 = s6 >> 21;
  s7 += carry6;
  s6 -= int64_lshift21(carry6);
  carry7 = s7 >> 21;
  s8 += carry7;
  s7 -= int64_lshift21(carry7);
  carry8 = s8 >> 21;
  s9 += carry8;
  s8 -= int64_lshift21(carry8);
  carry9 = s9 >> 21;
  s10 += carry9;
  s9 -= int64_lshift21(carry9);
  carry10 = s10 >> 21;
  s11 += carry10;
  s10 -= int64_lshift21(carry10);

  s[0] = s0 >> 0;
  s[1] = s0 >> 8;
  s[2] = (s0 >> 16) | (s1 << 5);
  s[3] = s1 >> 3;
  s[4] = s1 >> 11;
  s[5] = (s1 >> 19) | (s2 << 2);
  s[6] = s2 >> 6;
  s[7] = (s2 >> 14) | (s3 << 7);
  s[8] = s3 >> 1;
  s[9] = s3 >> 9;
  s[10] = (s3 >> 17) | (s4 << 4);
  s[11] = s4 >> 4;
  s[12] = s4 >> 12;
  s[13] = (s4 >> 20) | (s5 << 1);
  s[14] = s5 >> 7;
  s[15] = (s5 >> 15) | (s6 << 6);
  s[16] = s6 >> 2;
  s[17] = s6 >> 10;
  s[18] = (s6 >> 18) | (s7 << 3);
  s[19] = s7 >> 5;
  s[20] = s7 >> 13;
  s[21] = s8 >> 0;
  s[22] = s8 >> 8;
  s[23] = (s8 >> 16) | (s9 << 5);
  s[24] = s9 >> 3;
  s[25] = s9 >> 11;
  s[26] = (s9 >> 19) | (s10 << 2);
  s[27] = s10 >> 6;
  s[28] = (s10 >> 14) | (s11 << 7);
  s[29] = s11 >> 1;
  s[30] = s11 >> 9;
  s[31] = s11 >> 17;
}